

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-immediate.c
# Opt level: O2

void alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_b = 0;
  if ((uv_udp_t *)handle == &client || (uv_udp_t *)handle == &server) {
    eval_b = 0x10000;
    if ((long)suggested_size < 0x10001) {
      buf->base = alloc_cb::slab;
      buf->len = 0x10000;
      return;
    }
    pcVar2 = "<=";
    pcVar3 = "sizeof(slab)";
    pcVar1 = "suggested_size";
    uVar4 = 0x2d;
    eval_a = suggested_size;
  }
  else {
    pcVar2 = "!=";
    pcVar3 = "0";
    pcVar1 = "(uv_udp_t*)(handle) == &server || (uv_udp_t*)(handle) == &client";
    uVar4 = 0x2c;
    eval_a = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
          ,uVar4,pcVar1,pcVar2,pcVar3,eval_a,pcVar2,eval_b);
  abort();
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT_LE(suggested_size, sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
}